

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_SetConversation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  FStrifeDialogueNode *pFVar2;
  long lVar3;
  long *plVar4;
  
  if (arg1 == 0) {
    iVar1 = -1;
    pFVar2 = (FStrifeDialogueNode *)0x0;
  }
  else {
    iVar1 = GetConversation(arg1);
    if (iVar1 == -1) {
      return 0;
    }
    pFVar2 = StrifeDialogues.Array[iVar1];
  }
  if (arg0 == 0) {
    if (it != (AActor *)0x0) {
      it->ConversationRoot = iVar1;
      it->Conversation = pFVar2;
    }
  }
  else {
    lVar3 = 0;
    while( true ) {
      plVar4 = (long *)(lVar3 + 0x288);
      if (lVar3 == 0) {
        plVar4 = (long *)((long)AActor::TIDHash + (ulong)((arg0 & 0x7fU) << 3));
      }
      for (lVar3 = *plVar4; (lVar3 != 0 && (*(int *)(lVar3 + 0x260) != arg0));
          lVar3 = *(long *)(lVar3 + 0x288)) {
      }
      if (lVar3 == 0) break;
      *(int *)(lVar3 + 0x428) = iVar1;
      *(FStrifeDialogueNode **)(lVar3 + 0x430) = pFVar2;
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_SetConversation)
// Thing_SetConversation (tid, dlg_id)
{
	int dlg_index = -1;
	FStrifeDialogueNode *node = NULL;

	if (arg1 != 0)
	{
		dlg_index = GetConversation(arg1);	
		if (dlg_index == -1) return false;
		node = StrifeDialogues[dlg_index];
	}

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		while ((it = iterator.Next()) != NULL)
		{
			it->ConversationRoot = dlg_index;
			it->Conversation = node;
		}
	}
	else if (it)
	{
		it->ConversationRoot = dlg_index;
		it->Conversation = node;
	}
	return true;
}